

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  int _h;
  Mat *this_00;
  Mat *this_01;
  pointer pMVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  int i;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int q_1;
  int iVar10;
  int _c;
  int q;
  uint uVar11;
  float fVar12;
  Mat local_98;
  pointer local_58;
  Eltwise *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar10 = this_00->w;
  _h = this_00->h;
  _c = this_00->c;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_01,iVar10,_h,_c,this_00->elemsize,opt->blob_allocator);
  iVar6 = -100;
  if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
    uVar11 = _h * iVar10;
    iVar10 = this->op_type;
    if (iVar10 == 2) {
      pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if (_c < 1) {
        _c = 0;
      }
      for (; iVar10 != _c; iVar10 = iVar10 + 1) {
        Mat::channel(&local_98,this_00,iVar10);
        pvVar3 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,pMVar2 + 1,iVar10);
        pvVar4 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,this_01,iVar10);
        pvVar5 = local_98.data;
        Mat::~Mat(&local_98);
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          fVar12 = *(float *)((long)pvVar4 + uVar7 * 4);
          fVar1 = *(float *)((long)pvVar3 + uVar7 * 4);
          if (fVar12 <= fVar1) {
            fVar12 = fVar1;
          }
          *(float *)((long)pvVar5 + uVar7 * 4) = fVar12;
        }
      }
      for (uVar7 = 2;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
          uVar7 = uVar7 + 1) {
        for (iVar10 = 0; iVar10 != _c; iVar10 = iVar10 + 1) {
          Mat::channel(&local_98,pMVar2 + uVar7,iVar10);
          pvVar3 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,iVar10);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
            fVar12 = *(float *)((long)pvVar3 + uVar8 * 4);
            fVar1 = *(float *)((long)pvVar4 + uVar8 * 4);
            if (fVar12 <= fVar1) {
              fVar12 = fVar1;
            }
            *(float *)((long)pvVar4 + uVar8 * 4) = fVar12;
          }
        }
      }
    }
    else if (iVar10 == 1) {
      local_58 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start + 1;
      if ((this->coeffs).w == 0) {
        iVar10 = 0;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        if (_c < 1) {
          _c = 0;
        }
        for (; iVar10 != _c; iVar10 = iVar10 + 1) {
          Mat::channel(&local_98,this_00,iVar10);
          pvVar3 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,local_58,iVar10);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,iVar10);
          pvVar5 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar5 + uVar7 * 4) =
                 *(float *)((long)pvVar4 + uVar7 * 4) + *(float *)((long)pvVar3 + uVar7 * 4);
          }
        }
        for (uVar7 = 2;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar7 < (ulong)((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
            uVar7 = uVar7 + 1) {
          for (iVar10 = 0; iVar10 != _c; iVar10 = iVar10 + 1) {
            Mat::channel(&local_98,pMVar2 + uVar7,iVar10);
            pvVar3 = local_98.data;
            Mat::~Mat(&local_98);
            Mat::channel(&local_98,this_01,iVar10);
            pvVar4 = local_98.data;
            Mat::~Mat(&local_98);
            for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar4 + uVar8 * 4) =
                   *(float *)((long)pvVar4 + uVar8 * 4) + *(float *)((long)pvVar3 + uVar8 * 4);
            }
          }
        }
      }
      else {
        local_48 = *(this->coeffs).data;
        uVar8 = 0;
        uVar7 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar7 = uVar8;
        }
        if (_c < 1) {
          _c = 0;
        }
        uStack_40 = 0;
        local_50 = this;
        while (iVar10 = (int)uVar8, iVar10 != _c) {
          Mat::channel(&local_98,this_00,iVar10);
          pvVar3 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,local_58,iVar10);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,iVar10);
          pvVar5 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar5 + uVar8 * 4) =
                 *(float *)((long)pvVar4 + uVar8 * 4) * local_48._4_4_ +
                 *(float *)((long)pvVar3 + uVar8 * 4) * (float)local_48;
          }
          uVar8 = (ulong)(iVar10 + 1);
        }
        for (uVar8 = 2;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
            uVar8 = uVar8 + 1) {
          fVar12 = *(float *)((long)(local_50->coeffs).data + (long)(int)uVar8 * 4);
          for (iVar10 = 0; iVar10 != _c; iVar10 = iVar10 + 1) {
            Mat::channel(&local_98,pMVar2 + uVar8,iVar10);
            pvVar3 = local_98.data;
            Mat::~Mat(&local_98);
            Mat::channel(&local_98,this_01,iVar10);
            pvVar4 = local_98.data;
            Mat::~Mat(&local_98);
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar4 + uVar9 * 4) =
                   *(float *)((long)pvVar3 + uVar9 * 4) * fVar12 +
                   *(float *)((long)pvVar4 + uVar9 * 4);
            }
          }
        }
      }
    }
    else {
      if (iVar10 != 0) {
        return 0;
      }
      pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if (_c < 1) {
        _c = 0;
      }
      for (; iVar10 != _c; iVar10 = iVar10 + 1) {
        Mat::channel(&local_98,this_00,iVar10);
        pvVar3 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,pMVar2 + 1,iVar10);
        pvVar4 = local_98.data;
        Mat::~Mat(&local_98);
        Mat::channel(&local_98,this_01,iVar10);
        pvVar5 = local_98.data;
        Mat::~Mat(&local_98);
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar5 + uVar7 * 4) =
               *(float *)((long)pvVar4 + uVar7 * 4) * *(float *)((long)pvVar3 + uVar7 * 4);
        }
      }
      for (uVar7 = 2;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
          uVar7 = uVar7 + 1) {
        for (iVar10 = 0; iVar10 != _c; iVar10 = iVar10 + 1) {
          Mat::channel(&local_98,pMVar2 + uVar7,iVar10);
          pvVar3 = local_98.data;
          Mat::~Mat(&local_98);
          Mat::channel(&local_98,this_01,iVar10);
          pvVar4 = local_98.data;
          Mat::~Mat(&local_98);
          for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar4 + uVar8 * 4) =
                 *(float *)((long)pvVar4 + uVar8 * 4) * *(float *)((long)pvVar3 + uVar8 * 4);
          }
        }
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}